

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O2

string * __thiscall
glu::parseVariableName_abi_cxx11_(string *__return_storage_ptr__,glu *this,char *nameWithPath)

{
  TestError *this_00;
  VarTokenizer tokenizer;
  
  VarTokenizer::VarTokenizer(&tokenizer,(char *)this);
  if (tokenizer.m_token == TOKEN_IDENTIFIER) {
    VarTokenizer::getIdentifier_abi_cxx11_(__return_storage_ptr__,&tokenizer);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
             ,0x5d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string parseVariableName (const char* nameWithPath)
{
	VarTokenizer tokenizer(nameWithPath);
	TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
	return tokenizer.getIdentifier();
}